

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_memory.c
# Opt level: O2

int pageProtect(void *ptr,size_t bytes,int rules,char **errfunc)

{
  int iVar1;
  
  iVar1 = mprotect(ptr,bytes,rules);
  if (iVar1 == -1) {
    iVar1 = 0x120880;
    *errfunc = "mprotect";
  }
  return iVar1;
}

Assistant:

static inline int pageProtect(void* ptr, size_t bytes, int rules, char **errfunc) {
#if defined(_WIN32) || defined(__CYGWIN__)
	DWORD oldp;
	if (!VirtualProtect(ptr, bytes, (DWORD)rules, &oldp)) {
		Fail("VirtualProtect");
	}
#else
	if (-1 == mprotect(ptr, bytes, rules))
		Fail("mprotect");
#endif
	return 0;
}